

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadFunctionSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint local_38;
  uint local_34;
  Index sig_index;
  Index func_index;
  Index i;
  Enum local_24;
  Offset local_20;
  Offset section_size_local;
  BinaryReader *this_local;
  
  local_20 = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x16])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&this->num_function_signatures_,"function signature count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      func_index = (*this->delegate_->_vptr_BinaryReaderDelegate[0x17])();
      bVar1 = Succeeded((Result)func_index);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (sig_index = 0; sig_index < this->num_function_signatures_; sig_index = sig_index + 1) {
          local_34 = this->num_func_imports_ + sig_index;
          RVar2 = ReadIndex(this,&local_38,"function signature index");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if (this->num_signatures_ <= local_38) {
            PrintError(this,"invalid function signature index: %u",(ulong)local_38);
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x18])
                                  (this->delegate_,(ulong)local_34,(ulong)local_38);
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnFunction callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x19])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndFunctionSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnFunctionCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginFunctionSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadFunctionSection(Offset section_size) {
  CALLBACK(BeginFunctionSection, section_size);
  CHECK_RESULT(
      ReadCount(&num_function_signatures_, "function signature count"));
  CALLBACK(OnFunctionCount, num_function_signatures_);
  for (Index i = 0; i < num_function_signatures_; ++i) {
    Index func_index = num_func_imports_ + i;
    Index sig_index;
    CHECK_RESULT(ReadIndex(&sig_index, "function signature index"));
    ERROR_UNLESS(sig_index < num_signatures_,
                 "invalid function signature index: %" PRIindex, sig_index);
    CALLBACK(OnFunction, func_index, sig_index);
  }
  CALLBACK0(EndFunctionSection);
  return Result::Ok;
}